

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

double Abc_NtkCountNodes_rec(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  double dVar2;
  int local_34;
  Abc_Ntk_t *pAStack_30;
  int i;
  double Counter;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vOrder;
  Abc_Ntk_t *pNtk_local;
  
  pAStack_30 = (Abc_Ntk_t *)0x0;
  if (pNtk->dTemp < 0.0) {
    p = Abc_NtkDfsBoxes(pNtk);
    for (local_34 = 0; iVar1 = Vec_PtrSize(p), local_34 < iVar1; local_34 = local_34 + 1) {
      pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p,local_34);
      iVar1 = Abc_ObjIsNode(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Abc_ObjIsBox(pObj_00);
        if ((iVar1 != 0) && ((Abc_Ntk_t *)(pObj_00->field_5).pData != pNtk)) {
          dVar2 = Abc_NtkCountNodes_rec((Abc_Ntk_t *)(pObj_00->field_5).pData);
          pAStack_30 = (Abc_Ntk_t *)(dVar2 + (double)pAStack_30);
        }
      }
      else {
        pAStack_30 = (Abc_Ntk_t *)((double)pAStack_30 + 1.0);
      }
    }
    Vec_PtrFree(p);
    pNtk->dTemp = (double)pAStack_30;
    pNtk_local = pAStack_30;
  }
  else {
    pNtk_local = (Abc_Ntk_t *)pNtk->dTemp;
  }
  return (double)pNtk_local;
}

Assistant:

double Abc_NtkCountNodes_rec( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    double Counter = 0;
    int i;
    if ( pNtk->dTemp >= 0 )
        return pNtk->dTemp;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsNode(pObj) )
            Counter++;
        else if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Counter += Abc_NtkCountNodes_rec( (Abc_Ntk_t *)pObj->pData );
    Vec_PtrFree( vOrder );
    return pNtk->dTemp = Counter;
}